

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_lu.c
# Opt level: O3

_Bool test_lu_mul_x(_Bool inplace,int n_row,int n_col,int N,int field)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong __n;
  uint8_t *memory;
  int n_row_00;
  ulong uVar8;
  ulong uVar9;
  m256v *M;
  m256v *M_00;
  ulong uVar10;
  uint8_t *memory_00;
  int *rp;
  ulong uVar11;
  undefined7 in_register_00000039;
  int *cp;
  uint8_t *memory_01;
  uint8_t *puVar12;
  int *inverted_out;
  _Bool _Var13;
  uint8_t auStack_180 [8];
  ulong uStack_178;
  int aiStack_170 [2];
  undefined1 local_168 [8];
  m256v Y1;
  m256v Y2;
  m256v Xi;
  m256v A;
  m256v X;
  m256v LU;
  
  bVar5 = get_mask(N);
  __n = (ulong)(uint)(n_col * n_row);
  n_row_00 = n_col;
  if (n_col < n_row) {
    n_row_00 = n_row;
  }
  if ((int)CONCAT71(in_register_00000039,inplace) == 0) {
    n_row_00 = n_col;
  }
  _Var13 = false;
  uVar11 = __n + 0xf & 0xfffffffffffffff0;
  uVar8 = (ulong)(uint)(n_row * 8) + 0xf & 0xfffffffffffffff0;
  uVar9 = 0;
  while( true ) {
    lVar1 = -uVar11;
    puVar12 = local_168 + lVar1;
    if (0 < n_col * n_row) {
      uVar10 = 0;
      do {
        *(undefined8 *)((long)aiStack_170 + lVar1) = 0x101a70;
        iVar6 = rand();
        puVar12[uVar10] = (byte)iVar6 & bVar5;
        uVar10 = uVar10 + 1;
      } while (__n != uVar10);
    }
    *(undefined8 *)((long)aiStack_170 + lVar1) = 0x101a95;
    m256v_make((m256v *)&Xi.e,n_row,n_col,puVar12);
    lVar2 = -((ulong)(uint)(n_row_00 * 8) + 0xf & 0xfffffffffffffff0);
    memory_01 = puVar12 + lVar2;
    if (0 < n_row_00) {
      uVar10 = 0;
      do {
        memory_01[-8] = 0xb6;
        memory_01[-7] = '\x1a';
        memory_01[-6] = '\x10';
        memory_01[-5] = '\0';
        memory_01[-4] = '\0';
        memory_01[-3] = '\0';
        memory_01[-2] = '\0';
        memory_01[-1] = '\0';
        iVar6 = rand();
        memory_01[uVar10] = (byte)iVar6 & bVar5;
        uVar10 = uVar10 + 1;
      } while ((uint)(n_row_00 * 8) != uVar10);
    }
    memory_01[-8] = 0xdd;
    memory_01[-7] = '\x1a';
    memory_01[-6] = '\x10';
    memory_01[-5] = '\0';
    memory_01[-4] = '\0';
    memory_01[-3] = '\0';
    memory_01[-2] = '\0';
    memory_01[-1] = '\0';
    m256v_make((m256v *)&Y2.e,n_row_00,8,memory_01);
    memory_01[-8] = 0xf4;
    memory_01[-7] = '\x1a';
    memory_01[-6] = '\x10';
    memory_01[-5] = '\0';
    memory_01[-4] = '\0';
    memory_01[-3] = '\0';
    memory_01[-2] = '\0';
    memory_01[-1] = '\0';
    m256v_make((m256v *)&A.e,n_col,8,memory_01);
    lVar3 = -uVar8;
    memory = memory_01 + lVar3;
    builtin_memcpy(local_168 + lVar3 + lVar2 + lVar1 + -8," \x1b\x10",4);
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_make((m256v *)local_168,n_row,8,memory);
    builtin_memcpy(local_168 + lVar3 + lVar2 + lVar1 + -8,"6\x1b\x10",4);
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_mul((m256v *)&Xi.e,(m256v *)&A.e,(m256v *)local_168);
    lVar4 = -uVar11;
    memory_00 = memory + lVar4;
    builtin_memcpy(local_168 + lVar4 + lVar3 + lVar2 + lVar1 + -8,"U\x1b\x10",4);
    memory_00[-4] = '\0';
    memory_00[-3] = '\0';
    memory_00[-2] = '\0';
    memory_00[-1] = '\0';
    m256v_make((m256v *)&X.e,n_row,n_col,memory_00);
    builtin_memcpy(local_168 + lVar4 + lVar3 + lVar2 + lVar1 + -8,"d\x1b\x10",4);
    memory_00[-4] = '\0';
    memory_00[-3] = '\0';
    memory_00[-2] = '\0';
    memory_00[-1] = '\0';
    memcpy(memory_00,puVar12,__n);
    uVar10 = (ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0;
    rp = (int *)(memory_00 + -uVar10);
    cp = (int *)((long)rp - ((ulong)(uint)n_col * 4 + 0xf & 0xfffffffffffffff0));
    cp[-2] = 0x101ba6;
    cp[-1] = 0;
    m256v_LU_decomp_inplace((m256v *)&X.e,rp,cp);
    puVar12 = (uint8_t *)((long)cp - uVar8);
    if (inplace) {
      inverted_out = (int *)(puVar12 + -uVar10);
      inverted_out[-2] = 0x101be4;
      inverted_out[-1] = 0;
      perm_invert(n_row,rp,inverted_out);
      inverted_out[-2] = 0x101c01;
      inverted_out[-1] = 0;
      m256v_LU_mult_inplace((m256v *)&X.e,inverted_out,cp,(m256v *)&Y2.e);
    }
    else {
      builtin_memcpy(puVar12 + -8,"%\x1c\x10",4);
      puVar12[-4] = '\0';
      puVar12[-3] = '\0';
      puVar12[-2] = '\0';
      puVar12[-1] = '\0';
      m256v_make((m256v *)&Y1.e,n_row,8,puVar12);
      builtin_memcpy(puVar12 + -8,"A\x1c\x10",4);
      puVar12[-4] = '\0';
      puVar12[-3] = '\0';
      puVar12[-2] = '\0';
      puVar12[-1] = '\0';
      m256v_LU_mult((m256v *)&X.e,rp,cp,(m256v *)&A.e,(m256v *)&Y1.e);
      memory_01 = puVar12;
    }
    builtin_memcpy(puVar12 + -8,"[\x1c\x10",4);
    puVar12[-4] = '\0';
    puVar12[-3] = '\0';
    puVar12[-2] = '\0';
    puVar12[-1] = '\0';
    iVar6 = bcmp(memory,memory_01,(ulong)(uint)(n_row * 8));
    if (iVar6 != 0) break;
    _Var13 = 0x270e < (uint)uVar9;
    uVar7 = (uint)uVar9 + 1;
    uVar9 = (ulong)uVar7;
    if (uVar7 == 10000) {
      return true;
    }
  }
  *(ulong *)(puVar12 + -0x10) = uVar9;
  puVar12[-0x18] = 199;
  puVar12[-0x17] = '\x1c';
  puVar12[-0x16] = '\x10';
  puVar12[-0x15] = '\0';
  puVar12[-0x14] = '\0';
  puVar12[-0x13] = '\0';
  puVar12[-0x12] = '\0';
  puVar12[-0x11] = '\0';
  fprintf(_stderr,"Error:  A*X != PLUQ*X. (inplace=%d, n_row=%d, n_col=%d, field=%d, it=%d)\n",
          (ulong)inplace,(ulong)(uint)n_row,(ulong)(uint)n_col,(ulong)(uint)N);
  puVar12[-8] = 0xe4;
  puVar12[-7] = '\x1c';
  puVar12[-6] = '\x10';
  puVar12[-5] = '\0';
  puVar12[-4] = '\0';
  puVar12[-3] = '\0';
  puVar12[-2] = '\0';
  puVar12[-1] = '\0';
  fwrite("        Details about the test case:\n",0x25,1,_stderr);
  puVar12[-8] = 0xfd;
  puVar12[-7] = '\x1c';
  puVar12[-6] = '\x10';
  puVar12[-5] = '\0';
  puVar12[-4] = '\0';
  puVar12[-3] = '\0';
  puVar12[-2] = '\0';
  puVar12[-1] = '\0';
  fwrite("        rp = ",0xd,1,_stderr);
  puVar12[-8] = '\x0f';
  puVar12[-7] = '\x1d';
  puVar12[-6] = '\x10';
  puVar12[-5] = '\0';
  puVar12[-4] = '\0';
  puVar12[-3] = '\0';
  puVar12[-2] = '\0';
  puVar12[-1] = '\0';
  print_int_arr((FILE *)_stderr,n_row,rp);
  puVar12[-8] = '(';
  puVar12[-7] = '\x1d';
  puVar12[-6] = '\x10';
  puVar12[-5] = '\0';
  puVar12[-4] = '\0';
  puVar12[-3] = '\0';
  puVar12[-2] = '\0';
  puVar12[-1] = '\0';
  fwrite("        cp = ",0xd,1,_stderr);
  puVar12[-8] = ':';
  puVar12[-7] = '\x1d';
  puVar12[-6] = '\x10';
  puVar12[-5] = '\0';
  puVar12[-4] = '\0';
  puVar12[-3] = '\0';
  puVar12[-2] = '\0';
  puVar12[-1] = '\0';
  print_int_arr((FILE *)_stderr,n_col,cp);
  puVar12[-8] = 'S';
  puVar12[-7] = '\x1d';
  puVar12[-6] = '\x10';
  puVar12[-5] = '\0';
  puVar12[-4] = '\0';
  puVar12[-3] = '\0';
  puVar12[-2] = '\0';
  puVar12[-1] = '\0';
  fwrite("        matrix A:\n",0x12,1,_stderr);
  puVar12[-8] = 'b';
  puVar12[-7] = '\x1d';
  puVar12[-6] = '\x10';
  puVar12[-5] = '\0';
  puVar12[-4] = '\0';
  puVar12[-3] = '\0';
  puVar12[-2] = '\0';
  puVar12[-1] = '\0';
  print_mat((FILE *)_stderr,(char *)&Xi.e,M);
  puVar12[-8] = '{';
  puVar12[-7] = '\x1d';
  puVar12[-6] = '\x10';
  puVar12[-5] = '\0';
  puVar12[-4] = '\0';
  puVar12[-3] = '\0';
  puVar12[-2] = '\0';
  puVar12[-1] = '\0';
  fwrite("        matrix LU:\n",0x13,1,_stderr);
  puVar12[-8] = 0x8a;
  puVar12[-7] = '\x1d';
  puVar12[-6] = '\x10';
  puVar12[-5] = '\0';
  puVar12[-4] = '\0';
  puVar12[-3] = '\0';
  puVar12[-2] = '\0';
  puVar12[-1] = '\0';
  print_mat((FILE *)_stderr,(char *)&X.e,M_00);
  return _Var13;
}

Assistant:

static bool test_lu_mul_x(bool inplace, int n_row, int n_col, int N, int field)
{
	const uint8_t mask = get_mask(field);
	const int dlen = 8;

	for (int i = 0; i < N; ++i) {
		/* Create a random matrix */
		Def_mat256_rand(A, a, n_row, n_col, mask)
		Def_mat256_rand(Xi, x,
			(inplace && n_row > n_col) ? n_row : n_col,
			dlen, mask)
		m256v X = m256v_make(n_col, dlen, x);

		/* Compute A*X the direct way */
		m256v_Def(Y1, y1, n_row, dlen)
		m256v_mul(&A, &X, &Y1);

		/* Copy A -> LU */
		m256v_Def(LU, lu, n_row, n_col)
		memcpy(lu, a, sizeof(lu));

		/* Calculate LU decomposition */
		int rp[n_row], cp[n_col];
		m256v_LU_decomp_inplace(&LU, rp, cp);

		/* Compute A*X via LU decomposition */
		uint8_t y2_back[n_row * dlen];
		uint8_t* y2;
		if (!inplace) {
			/* non-inplace.  Test m256v_LU_mult */
			m256v Y2 = m256v_make(n_row, dlen, y2_back);
			m256v_LU_mult(&LU, rp, cp, &X, &Y2);

			y2 = y2_back;
		} else {
			/* inplace.  Test m256v_LU_mult_inplace */
			int inv_rp[n_row];
			perm_invert(n_row, rp, inv_rp);
			m256v_LU_mult_inplace(&LU,
						inv_rp,
						cp,
						&Xi);

			y2 = x;
		}

		/* Compare */
		if (memcmp(y1, y2, sizeof(y1)) != 0) {
			fprintf(stderr, "Error:  A*X != PLUQ*X. "
			  "(inplace=%d, n_row=%d, n_col=%d, field=%d, it=%d)\n",
			  inplace, n_row, n_col, field, i);

			/* Print details on the test case */
			fprintf(stderr, "        Details about the "
			  "test case:\n");
			fprintf(stderr, "        rp = ");
			print_int_arr(stderr, n_row, rp);
			fprintf(stderr, "        cp = ");
			print_int_arr(stderr, n_col, cp);
			fprintf(stderr, "        matrix A:\n");
			print_mat(stderr, "        ", &A);
			fprintf(stderr, "        matrix LU:\n");
			print_mat(stderr, "        ", &LU);
			return false;
		}

	}
	return true;
}